

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManSortPairsInt(word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
                        Vec_Int_t *vUnatePairsW,Vec_Wec_t *vSorter)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  word *x;
  word *y;
  Vec_Int_t *p;
  word *pDiv1;
  word *pDiv0;
  int iLit1;
  int iLit0;
  int fComp;
  Vec_Int_t *vLevel;
  int local_40;
  int iPair;
  int k;
  int i;
  Vec_Int_t *vUnatePairsW_local;
  Vec_Int_t *vUnatePairs_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word *pOn_local;
  word *pOff_local;
  
  Vec_WecInit(vSorter,nWords << 6);
  iPair = 0;
  do {
    iVar1 = Vec_IntSize(vUnatePairs);
    if (iVar1 <= iPair) {
      Vec_IntClear(vUnatePairs);
      Vec_IntClear(vUnatePairsW);
      local_40 = Vec_WecSize(vSorter);
      while (local_40 = local_40 + -1, -1 < local_40) {
        p = Vec_WecEntry(vSorter,local_40);
        for (iPair = 0; iVar1 = Vec_IntSize(p), iPair < iVar1; iPair = iPair + 1) {
          iVar1 = Vec_IntEntry(p,iPair);
          Vec_IntPush(vUnatePairs,iVar1);
          Vec_IntPush(vUnatePairsW,local_40);
        }
      }
      Vec_WecClear(vSorter);
      return;
    }
    iVar1 = Vec_IntEntry(vUnatePairs,iPair);
    iVar2 = Abc_LitIsCompl(iVar1);
    uVar3 = Abc_Lit2Var(iVar1);
    uVar3 = uVar3 & 0x7fff;
    iVar4 = Abc_Lit2Var(iVar1);
    iVar4 = iVar4 >> 0xf;
    iVar5 = Abc_Lit2Var(uVar3);
    x = (word *)Vec_PtrEntry(vDivs,iVar5);
    iVar5 = Abc_Lit2Var(iVar4);
    y = (word *)Vec_PtrEntry(vDivs,iVar5);
    if ((int)uVar3 < iVar4) {
      if (iVar2 != 0) {
        __assert_fail("!fComp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3ed,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar2 = Abc_LitIsCompl(uVar3);
      iVar4 = Abc_LitIsCompl(iVar4);
      iVar2 = Abc_TtCountOnesVecMask2(x,y,iVar2,iVar4,pOn,nWords);
      Vec_WecPush(vSorter,iVar2,iVar1);
    }
    else {
      iVar5 = Abc_LitIsCompl(uVar3);
      if (iVar5 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3f3,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar4 = Abc_LitIsCompl(iVar4);
      if (iVar4 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                      ,0x3f4,
                      "void Gia_ManSortPairsInt(word *, word *, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      iVar2 = Abc_TtCountOnesVecXorMask(x,y,iVar2,pOn,nWords);
      Vec_WecPush(vSorter,iVar2,iVar1);
    }
    iPair = iPair + 1;
  } while( true );
}

Assistant:

void Gia_ManSortPairsInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, Vec_Wec_t * vSorter )
{
    int i, k, iPair;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnatePairs, iPair, i )
    {
        int fComp = Abc_LitIsCompl(iPair);
        int iLit0 = Abc_Lit2Var(iPair) & 0x7FFF;
        int iLit1 = Abc_Lit2Var(iPair) >> 15;
        word * pDiv0 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit0) );
        word * pDiv1 = (word *)Vec_PtrEntry( vDivs, Abc_Lit2Var(iLit1) );
        if ( iLit0 < iLit1 )
        {
            assert( !fComp );
            //assert( !Abc_TtIntersectTwo( pOff, 0, pDiv0, Abc_LitIsCompl(iLit0), pDiv1, Abc_LitIsCompl(iLit1), nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecMask2(pDiv0, pDiv1, Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1), pOn, nWords), iPair );
        }
        else
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            //assert( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, fComp, nWords ) );
            Vec_WecPush( vSorter, Abc_TtCountOnesVecXorMask(pDiv0, pDiv1, fComp, pOn, nWords), iPair );
        }
    }
    Vec_IntClear( vUnatePairs );
    Vec_IntClear( vUnatePairsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iPair, i )
        {
            Vec_IntPush( vUnatePairs, iPair );
            Vec_IntPush( vUnatePairsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );

}